

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

void __thiscall Fl_Menu_Item::setonly(Fl_Menu_Item *this)

{
  int *piVar1;
  uint uVar2;
  
  uVar2 = this->flags | 0xc;
  this->flags = uVar2;
  for (piVar1 = &this[1].flags;
      ((-1 < (char)uVar2 && (((Fl_Menu_Item *)(piVar1 + -8))->text != (char *)0x0)) &&
      ((*piVar1 & 8U) != 0)); piVar1 = piVar1 + 0xe) {
    uVar2 = *piVar1 & 0xfffffffb;
    *piVar1 = uVar2;
  }
  for (piVar1 = &this[-1].flags;
      (((Fl_Menu_Item *)(piVar1 + -8))->text != (char *)0x0 && ((*piVar1 & 0x88U) == 8));
      piVar1 = piVar1 + -0xe) {
    *piVar1 = *piVar1 & 0xffffff7b;
  }
  return;
}

Assistant:

void Fl_Menu_Item::setonly() {
  flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = this; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = this-1; ; j--) { // go up
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}